

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O0

bool google::protobuf::json_internal::Proto2Descriptor::Is32Bit(Field f)

{
  CppType CVar1;
  Field f_local;
  
  CVar1 = FieldDescriptor::cpp_type(f);
  if ((((CVar1 == CPPTYPE_INT32) || (CVar1 == CPPTYPE_UINT32)) || (CVar1 == CPPTYPE_FLOAT)) ||
     (CVar1 == CPPTYPE_ENUM)) {
    f_local._7_1_ = true;
  }
  else {
    f_local._7_1_ = false;
  }
  return f_local._7_1_;
}

Assistant:

static bool Is32Bit(Field f) {
    switch (f->cpp_type()) {
      case FieldDescriptor::CPPTYPE_UINT32:
      case FieldDescriptor::CPPTYPE_INT32:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_FLOAT:
        return true;
      default:
        return false;
    }
  }